

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void test_ecmult_multi_batching(void)

{
  int iVar1;
  void *__ptr;
  void *__ptr_00;
  size_t scratch_size_1;
  size_t scratch_size;
  int bucket_window;
  secp256k1_gej ptgj;
  secp256k1_ge ptg;
  secp256k1_scratch *scratch;
  int i;
  ecmult_multi_data data;
  secp256k1_gej r2;
  secp256k1_gej r;
  secp256k1_ge *pt;
  secp256k1_scalar *sc;
  secp256k1_scalar scG;
  secp256k1_scalar *in_stack_00000648;
  secp256k1_scalar *in_stack_00000650;
  secp256k1_gej *in_stack_00000658;
  secp256k1_gej *in_stack_00000660;
  secp256k1_gej *in_stack_fffffffffffffd58;
  secp256k1_scratch *psVar2;
  secp256k1_gej *in_stack_fffffffffffffd60;
  secp256k1_callback *error_callback;
  size_t in_stack_fffffffffffffd68;
  secp256k1_callback *in_stack_fffffffffffffd70;
  secp256k1_scalar *in_stack_fffffffffffffd80;
  secp256k1_ge *in_stack_fffffffffffffd90;
  undefined1 local_1e8 [56];
  void *in_stack_fffffffffffffe50;
  secp256k1_ecmult_multi_callback *in_stack_fffffffffffffe58;
  secp256k1_scalar *in_stack_fffffffffffffe60;
  secp256k1_gej *in_stack_fffffffffffffe68;
  secp256k1_scratch *in_stack_fffffffffffffe70;
  secp256k1_callback *in_stack_fffffffffffffe78;
  int local_174;
  void *n;
  secp256k1_fe *in_stack_ffffffffffffff68;
  secp256k1_gej *in_stack_ffffffffffffff70;
  secp256k1_gej *in_stack_ffffffffffffff78;
  secp256k1_gej *in_stack_ffffffffffffff80;
  
  __ptr = checked_malloc((secp256k1_callback *)in_stack_fffffffffffffd60,
                         (size_t)in_stack_fffffffffffffd58);
  __ptr_00 = checked_malloc((secp256k1_callback *)in_stack_fffffffffffffd60,
                            (size_t)in_stack_fffffffffffffd58);
  secp256k1_gej_set_infinity((secp256k1_gej *)0x14bac4);
  testutil_random_scalar_order(in_stack_fffffffffffffd80);
  secp256k1_ecmult(in_stack_00000660,in_stack_00000658,in_stack_00000650,in_stack_00000648);
  for (local_174 = 0; local_174 < 0xb0; local_174 = local_174 + 1) {
    testutil_random_ge_test(in_stack_fffffffffffffd90);
    secp256k1_gej_set_ge(in_stack_fffffffffffffd60,(secp256k1_ge *)in_stack_fffffffffffffd58);
    memcpy((void *)((long)__ptr_00 + (long)local_174 * 0x68),local_1e8,0x68);
    testutil_random_scalar_order(in_stack_fffffffffffffd80);
    secp256k1_ecmult(in_stack_00000660,in_stack_00000658,in_stack_00000650,in_stack_00000648);
    secp256k1_gej_add_var
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
               in_stack_ffffffffffffff68);
  }
  n = __ptr;
  secp256k1_gej_neg(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  secp256k1_scratch_create(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  psVar2 = (secp256k1_scratch *)0xb0;
  iVar1 = secp256k1_ecmult_multi_var
                    (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                     in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                     (size_t)n);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x141e,
            "test condition failed: secp256k1_ecmult_multi_var(&CTX->error_callback, scratch, &r, &scG, ecmult_multi_callback, &data, n_points)"
           );
    abort();
  }
  secp256k1_gej_add_var
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
             in_stack_ffffffffffffff68);
  iVar1 = secp256k1_gej_is_infinity((secp256k1_gej *)0x14bcca);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1420,"test condition failed: secp256k1_gej_is_infinity(&r)");
    abort();
  }
  secp256k1_scratch_destroy((secp256k1_callback *)in_stack_fffffffffffffd60,psVar2);
  error_callback = &CTX->error_callback;
  secp256k1_pippenger_scratch_size(1,1);
  secp256k1_scratch_create(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  psVar2 = (secp256k1_scratch *)0xb0;
  iVar1 = secp256k1_ecmult_multi_var
                    (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,in_stack_fffffffffffffe68,
                     in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                     (size_t)n);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1427,
            "test condition failed: secp256k1_ecmult_multi_var(&CTX->error_callback, scratch, &r, &scG, ecmult_multi_callback, &data, n_points)"
           );
    abort();
  }
  secp256k1_gej_add_var
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
             in_stack_ffffffffffffff68);
  iVar1 = secp256k1_gej_is_infinity((secp256k1_gej *)0x14be1c);
  if (iVar1 == 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
            ,0x1429,"test condition failed: secp256k1_gej_is_infinity(&r)");
    abort();
  }
  secp256k1_scratch_destroy(error_callback,psVar2);
  local_174 = 1;
  while( true ) {
    if (0xb0 < local_174) {
      free(__ptr);
      free(__ptr_00);
      return;
    }
    if (local_174 < 0x59) {
      in_stack_fffffffffffffd68 = secp256k1_strauss_scratch_size((long)local_174);
      secp256k1_scratch_create(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
    }
    else {
      iVar1 = secp256k1_pippenger_bucket_window((long)local_174);
      in_stack_fffffffffffffd70 =
           (secp256k1_callback *)secp256k1_pippenger_scratch_size((long)local_174,iVar1);
      secp256k1_scratch_create(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
    }
    psVar2 = (secp256k1_scratch *)0xb0;
    iVar1 = secp256k1_ecmult_multi_var
                      (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70,in_stack_fffffffffffffe68
                       ,in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,
                       in_stack_fffffffffffffe50,(size_t)n);
    if (iVar1 == 0) break;
    secp256k1_gej_add_var
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
               in_stack_ffffffffffffff68);
    iVar1 = secp256k1_gej_is_infinity((secp256k1_gej *)0x14bfdf);
    if (iVar1 == 0) {
      fprintf(_stderr,"%s:%d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
              ,0x1437,"test condition failed: secp256k1_gej_is_infinity(&r)");
      abort();
    }
    secp256k1_scratch_destroy(error_callback,psVar2);
    local_174 = local_174 + 1;
  }
  fprintf(_stderr,"%s:%d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/secp256k1/src/tests.c"
          ,0x1435,
          "test condition failed: secp256k1_ecmult_multi_var(&CTX->error_callback, scratch, &r, &scG, ecmult_multi_callback, &data, n_points)"
         );
  abort();
}

Assistant:

static void test_ecmult_multi_batching(void) {
    static const int n_points = 2*ECMULT_PIPPENGER_THRESHOLD;
    secp256k1_scalar scG;
    secp256k1_scalar *sc = (secp256k1_scalar *)checked_malloc(&CTX->error_callback, sizeof(secp256k1_scalar) * n_points);
    secp256k1_ge *pt = (secp256k1_ge *)checked_malloc(&CTX->error_callback, sizeof(secp256k1_ge) * n_points);
    secp256k1_gej r;
    secp256k1_gej r2;
    ecmult_multi_data data;
    int i;
    secp256k1_scratch *scratch;

    secp256k1_gej_set_infinity(&r2);

    /* Get random scalars and group elements and compute result */
    testutil_random_scalar_order(&scG);
    secp256k1_ecmult(&r2, &r2, &secp256k1_scalar_zero, &scG);
    for(i = 0; i < n_points; i++) {
        secp256k1_ge ptg;
        secp256k1_gej ptgj;
        testutil_random_ge_test(&ptg);
        secp256k1_gej_set_ge(&ptgj, &ptg);
        pt[i] = ptg;
        testutil_random_scalar_order(&sc[i]);
        secp256k1_ecmult(&ptgj, &ptgj, &sc[i], NULL);
        secp256k1_gej_add_var(&r2, &r2, &ptgj, NULL);
    }
    data.sc = sc;
    data.pt = pt;
    secp256k1_gej_neg(&r2, &r2);

    /* Test with empty scratch space. It should compute the correct result using
     * ecmult_mult_simple algorithm which doesn't require a scratch space. */
    scratch = secp256k1_scratch_create(&CTX->error_callback, 0);
    CHECK(secp256k1_ecmult_multi_var(&CTX->error_callback, scratch, &r, &scG, ecmult_multi_callback, &data, n_points));
    secp256k1_gej_add_var(&r, &r, &r2, NULL);
    CHECK(secp256k1_gej_is_infinity(&r));
    secp256k1_scratch_destroy(&CTX->error_callback, scratch);

    /* Test with space for 1 point in pippenger. That's not enough because
     * ecmult_multi selects strauss which requires more memory. It should
     * therefore select the simple algorithm. */
    scratch = secp256k1_scratch_create(&CTX->error_callback, secp256k1_pippenger_scratch_size(1, 1) + PIPPENGER_SCRATCH_OBJECTS*ALIGNMENT);
    CHECK(secp256k1_ecmult_multi_var(&CTX->error_callback, scratch, &r, &scG, ecmult_multi_callback, &data, n_points));
    secp256k1_gej_add_var(&r, &r, &r2, NULL);
    CHECK(secp256k1_gej_is_infinity(&r));
    secp256k1_scratch_destroy(&CTX->error_callback, scratch);

    for(i = 1; i <= n_points; i++) {
        if (i > ECMULT_PIPPENGER_THRESHOLD) {
            int bucket_window = secp256k1_pippenger_bucket_window(i);
            size_t scratch_size = secp256k1_pippenger_scratch_size(i, bucket_window);
            scratch = secp256k1_scratch_create(&CTX->error_callback, scratch_size + PIPPENGER_SCRATCH_OBJECTS*ALIGNMENT);
        } else {
            size_t scratch_size = secp256k1_strauss_scratch_size(i);
            scratch = secp256k1_scratch_create(&CTX->error_callback, scratch_size + STRAUSS_SCRATCH_OBJECTS*ALIGNMENT);
        }
        CHECK(secp256k1_ecmult_multi_var(&CTX->error_callback, scratch, &r, &scG, ecmult_multi_callback, &data, n_points));
        secp256k1_gej_add_var(&r, &r, &r2, NULL);
        CHECK(secp256k1_gej_is_infinity(&r));
        secp256k1_scratch_destroy(&CTX->error_callback, scratch);
    }
    free(sc);
    free(pt);
}